

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fireworks.cpp
# Opt level: O1

bool __thiscall Fireworks::displayAnimation(Fireworks *this,Screen *screen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int explosionColor;
  int iVar5;
  int iVar6;
  Firework firework3;
  Firework firework2;
  Firework firework1;
  Firework local_240;
  Firework local_190;
  Firework local_e0;
  
  Screen::startAnimation(screen);
  iVar2 = Screen::createColor(screen,3,0);
  iVar3 = Screen::createColor(screen,6,0);
  iVar4 = Screen::createColor(screen,2,0);
  explosionColor = Screen::createColor(screen,5,0);
  Firework::Firework(&local_e0,'o','|',':','.');
  Firework::Firework(&local_190,'o','|',':','x');
  Firework::Firework(&local_240,'o','|',':','.');
  refresh();
  if (_stdscr == 0) {
    iVar5 = -1;
  }
  else {
    iVar5 = *(short *)(_stdscr + 6) + 1;
  }
  screen->screenSize[1] = iVar5;
  iVar5 = screen->screenSize[1];
  refresh();
  if (_stdscr == 0) {
    iVar6 = -1;
  }
  else {
    iVar6 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar6;
  iVar6 = iVar5 + 3;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  Firework::initializeFirework
            (&local_e0,iVar6 >> 2,screen->screenSize[0] / 2,0xc,iVar2,iVar3,screen);
  refresh();
  if (_stdscr == 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = *(short *)(_stdscr + 6) + 1;
  }
  screen->screenSize[1] = iVar3;
  iVar3 = screen->screenSize[1];
  refresh();
  if (_stdscr == 0) {
    iVar5 = -1;
  }
  else {
    iVar5 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar5;
  iVar5 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  Firework::initializeFirework
            (&local_190,(iVar5 >> 2) * 3,screen->screenSize[0] / 2,0xe,iVar2,iVar4,screen);
  refresh();
  if (_stdscr == 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = *(short *)(_stdscr + 6) + 1;
  }
  screen->screenSize[1] = iVar3;
  iVar3 = screen->screenSize[1];
  refresh();
  if (_stdscr == 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar4;
  Firework::initializeFirework
            (&local_240,iVar3 / 2,screen->screenSize[0] / 2,0x10,iVar2,explosionColor,screen);
  bVar1 = true;
  iVar2 = 0x18;
  iVar3 = 0xc;
  while (bVar1 != false) {
    Screen::clearScreen(screen);
    bVar1 = Firework::display(&local_e0,screen);
    if (iVar3 < 1) {
      bVar1 = Firework::display(&local_190,screen);
    }
    else {
      iVar3 = iVar3 + -1;
    }
    if (iVar2 < 1) {
      bVar1 = Firework::display(&local_240,screen);
    }
    else {
      iVar2 = iVar2 + -1;
    }
    Screen::refreshScreen(screen);
    usleep(0xa2c2);
  }
  Screen::endAnimation(screen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.explosionParticle._M_dataplus._M_p != &local_240.explosionParticle.field_2) {
    operator_delete(local_240.explosionParticle._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.tail._M_dataplus._M_p != &local_240.tail.field_2) {
    operator_delete(local_240.tail._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.stream._M_dataplus._M_p != &local_240.stream.field_2) {
    operator_delete(local_240.stream._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.ball._M_dataplus._M_p != &local_240.ball.field_2) {
    operator_delete(local_240.ball._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.explosionParticle._M_dataplus._M_p != &local_190.explosionParticle.field_2) {
    operator_delete(local_190.explosionParticle._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.tail._M_dataplus._M_p != &local_190.tail.field_2) {
    operator_delete(local_190.tail._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.stream._M_dataplus._M_p != &local_190.stream.field_2) {
    operator_delete(local_190.stream._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.ball._M_dataplus._M_p != &local_190.ball.field_2) {
    operator_delete(local_190.ball._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.explosionParticle._M_dataplus._M_p != &local_e0.explosionParticle.field_2) {
    operator_delete(local_e0.explosionParticle._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.tail._M_dataplus._M_p != &local_e0.tail.field_2) {
    operator_delete(local_e0.tail._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.stream._M_dataplus._M_p != &local_e0.stream.field_2) {
    operator_delete(local_e0.stream._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.ball._M_dataplus._M_p != &local_e0.ball.field_2) {
    operator_delete(local_e0.ball._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool Fireworks::displayAnimation(Screen &screen){

    screen.startAnimation();

    // Create the colors
    int streamerColor = screen.createColor(COLOR_YELLOW, COLOR_BLACK);
    int explosionColors[3];
    explosionColors[0] = screen.createColor(COLOR_CYAN, COLOR_BLACK);
    explosionColors[1] = screen.createColor(COLOR_GREEN, COLOR_BLACK);
    explosionColors[2] = screen.createColor(COLOR_MAGENTA, COLOR_BLACK);
    Firework firework1('o', '|', ':', '.');
    Firework firework2('o', '|', ':', 'x');
    Firework firework3('o', '|', ':', '.');

    firework1.initializeFirework(screen.getScreenSizeX() / 4,
                                 screen.getScreenSizeY() / 2,
                                 12,
                                 streamerColor,
                                 explosionColors[0],
                                 screen);

    firework2.initializeFirework(screen.getScreenSizeX() / 4 * 3,
                                 screen.getScreenSizeY() / 2,
                                 14,
                                 streamerColor,
                                 explosionColors[1],
                                 screen);
    firework3.initializeFirework(screen.getScreenSizeX() / 2,
                                 screen.getScreenSizeY() / 2,
                                 16,
                                 streamerColor,
                                 explosionColors[2],
                                 screen);

    // Set the delay between the two fireworks
    int delay1 = 1 * FRAMES_PER_SECOND / 2;
    int delay2 = delay1 * 2;
    bool activeFireworkFlag = true;

    // Loop until both fireworks are done displaying
    while (activeFireworkFlag){
        screen.clearScreen();
        activeFireworkFlag = firework1.display(screen);

        // Delay the second firework
        if (delay1 > 0){
            delay1 --;
        }
        else {
            activeFireworkFlag = firework2.display(screen);
        }

        if(delay2 > 0){
            delay2--;
        }
        else {
            activeFireworkFlag = firework3.display(screen);
        }

        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND);
    }


    screen.endAnimation();
    return true;
}